

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_array.h
# Opt level: O1

void __thiscall v_array<example>::resize(v_array<example> *this,size_t length)

{
  example *__ptr;
  example *peVar1;
  example *peVar2;
  ostream *poVar3;
  vw_exception *this_00;
  long lVar4;
  long lVar5;
  stringstream __msg;
  string sStack_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8;
  
  __ptr = this->_begin;
  if (((long)this->end_array - (long)__ptr >> 4) * -0x44d8c49e2629d3bb - length != 0) {
    peVar1 = this->_end;
    peVar2 = (example *)realloc(__ptr,length * 0x68d0);
    if (length * 0x68d0 != 0 && peVar2 == (example *)0x0) {
      std::__cxx11::stringstream::stringstream(local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>(&local_1a8,"realloc of ",0xb);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3," failed in resize().  out of memory?",0x24);
      this_00 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (this_00,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/v_array.h"
                 ,0x45,&sStack_1d8);
      __cxa_throw(this_00,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    lVar5 = (long)peVar1 - (long)__ptr;
    this->_begin = peVar2;
    if ((peVar2 != (example *)0x0) &&
       (lVar4 = length + (lVar5 >> 4) * 0x44d8c49e2629d3bb,
       (ulong)((lVar5 >> 4) * -0x44d8c49e2629d3bb) <= length && lVar4 != 0)) {
      memset((void *)((long)peVar2 + lVar5),0,lVar4 * 0x68d0);
    }
    this->_end = (example *)(lVar5 + (long)peVar2);
    this->end_array = peVar2 + length;
  }
  return;
}

Assistant:

void resize(size_t length)
  {
    if ((size_t)(end_array - _begin) != length)
    {
      size_t old_len = _end - _begin;
      T* temp = (T*)realloc(_begin, sizeof(T) * length);
      if ((temp == nullptr) && ((sizeof(T) * length) > 0))
      {
        THROW("realloc of " << length << " failed in resize().  out of memory?");
      }
      else
        _begin = temp;
      if (old_len < length && _begin + old_len != nullptr)
        memset(_begin + old_len, 0, (length - old_len) * sizeof(T));
      _end = _begin + old_len;
      end_array = _begin + length;
    }
  }